

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(void)

{
  uint __line;
  undefined8 *puVar1;
  open_close *poVar2;
  pause *ppVar3;
  stop *psVar4;
  Empty *t;
  Stopped *t_00;
  Playing *t_01;
  Playing *this;
  char *__assertion;
  Player p;
  cd_detected local_14;
  
  this = (Playing *)&p.super_StateMachine.state_;
  p.super_StateMachine.table_ = (Table<_15d3a665_> *)(anonymous_namespace)::player::transition_table
  ;
  p.super_StateMachine.state_.storage_ = (storage_type)0x0;
  p.super_StateMachine.state_.index_ = '\0';
  state_machine::variant::
  Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
  ::destroy_internal((Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
                      *)this);
  p.super_StateMachine.state_.index_ = '\x01';
  t = (Empty *)this;
  state_machine::variant::
  Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
  ::get<(anonymous_namespace)::Empty,_0>
            ((Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
              *)this);
  state_machine::state_machine::detail::on_entry<(anonymous_namespace)::Empty,_0>(t);
  if (p.super_StateMachine.state_.index_ == '\x01') {
    poVar2 = (open_close *)0xa;
    std::operator<<((ostream *)&std::cout,'\n');
    state_machine::state_machine::StateMachine<$9a4d5606$>::
    process_event<(anonymous_namespace)::open_close,_0>(&p.super_StateMachine,poVar2);
    if (p.super_StateMachine.state_.index_ == '\x03') {
      poVar2 = (open_close *)0xa;
      std::operator<<((ostream *)&std::cout,'\n');
      state_machine::state_machine::StateMachine<$9a4d5606$>::
      process_event<(anonymous_namespace)::open_close,_0>(&p.super_StateMachine,poVar2);
      if (p.super_StateMachine.state_.index_ != '\x01') {
        __assert_fail("p.is_state<Empty>()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                      ,0x83,"int main()");
      }
      std::operator<<((ostream *)&std::cout,'\n');
      local_14.disc_type = DVD;
      state_machine::state_machine::StateMachine<$9a4d5606$>::
      process_event<(anonymous_namespace)::cd_detected,_0>(&p.super_StateMachine,&local_14);
      if (p.super_StateMachine.state_.index_ != '\x01') {
        __assert_fail("p.is_state<Empty>()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                      ,0x89,"int main()");
      }
      std::operator<<((ostream *)&std::cout,'\n');
      local_14.disc_type = CD;
      state_machine::state_machine::StateMachine<$9a4d5606$>::
      process_event<(anonymous_namespace)::cd_detected,_0>(&p.super_StateMachine,&local_14);
      if (p.super_StateMachine.state_.index_ != '\x02') {
        __assert_fail("p.is_state<Stopped>()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                      ,0x8e,"int main()");
      }
      std::operator<<((ostream *)&std::cout,'\n');
      if (p.super_StateMachine.state_.index_ == '\x02') {
        state_machine::variant::
        Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
        ::get<(anonymous_namespace)::Stopped,_0>
                  ((Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
                    *)this);
        t_00 = (Stopped *)this;
        state_machine::variant::
        Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
        ::get<(anonymous_namespace)::Stopped,_0>
                  ((Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
                    *)this);
        state_machine::state_machine::detail::on_exit<(anonymous_namespace)::Stopped,_0>(t_00);
        t_01 = this;
        state_machine::variant::
        Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
        ::destroy_internal((Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
                            *)this);
        p.super_StateMachine.state_.index_ = '\x04';
        state_machine::state_machine::detail::on_entry<(anonymous_namespace)::Playing,_0>(t_01);
      }
      else if (p.super_StateMachine.state_.index_ == '\0') {
        puVar1 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar1 = &PTR__exception_00103d98;
        __cxa_throw(puVar1,&state_machine::state_machine::bad_state_access::typeinfo,
                    std::exception::~exception);
      }
      if (p.super_StateMachine.state_.index_ != '\x04') {
        __assert_fail("p.is_state<Playing>()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                      ,0x93,"int main()");
      }
      ppVar3 = (pause *)0xa;
      std::operator<<((ostream *)&std::cout,'\n');
      state_machine::state_machine::StateMachine<$9a4d5606$>::
      process_event<(anonymous_namespace)::pause,_0>(&p.super_StateMachine,ppVar3);
      if (p.super_StateMachine.state_.index_ != '\x05') {
        __assert_fail("p.is_state<Paused>()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                      ,0x98,"int main()");
      }
      std::operator<<((ostream *)&std::cout,'\n');
      if (p.super_StateMachine.state_.index_ == '\x05') {
        state_machine::variant::
        Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
        ::get<(anonymous_namespace)::Paused,_0>
                  ((Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
                    *)this);
        state_machine::variant::
        Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
        ::get<(anonymous_namespace)::Paused,_0>
                  ((Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
                    *)this);
        state_machine::variant::
        Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
        ::destroy_internal((Variant<(anonymous_namespace)::Empty,_(anonymous_namespace)::Stopped,_(anonymous_namespace)::Open,_(anonymous_namespace)::Playing,_(anonymous_namespace)::Paused>
                            *)this);
        p.super_StateMachine.state_.index_ = '\x04';
        state_machine::state_machine::detail::on_entry<(anonymous_namespace)::Playing,_0>(this);
      }
      else if (p.super_StateMachine.state_.index_ == '\0') {
        puVar1 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar1 = &PTR__exception_00103d98;
        __cxa_throw(puVar1,&state_machine::state_machine::bad_state_access::typeinfo,
                    std::exception::~exception);
      }
      if (p.super_StateMachine.state_.index_ != '\x04') {
        __assert_fail("p.is_state<Playing>()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                      ,0x9d,"int main()");
      }
      ppVar3 = (pause *)0xa;
      std::operator<<((ostream *)&std::cout,'\n');
      state_machine::state_machine::StateMachine<$9a4d5606$>::
      process_event<(anonymous_namespace)::pause,_0>(&p.super_StateMachine,ppVar3);
      if (p.super_StateMachine.state_.index_ != '\x05') {
        __assert_fail("p.is_state<Paused>()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                      ,0xa2,"int main()");
      }
      psVar4 = (stop *)0xa;
      std::operator<<((ostream *)&std::cout,'\n');
      state_machine::state_machine::StateMachine<$9a4d5606$>::
      process_event<(anonymous_namespace)::stop,_0>(&p.super_StateMachine,psVar4);
      if (p.super_StateMachine.state_.index_ == '\x02') {
        psVar4 = (stop *)0xa;
        std::operator<<((ostream *)&std::cout,'\n');
        state_machine::state_machine::StateMachine<$9a4d5606$>::
        process_event<(anonymous_namespace)::stop,_0>(&p.super_StateMachine,psVar4);
        if (p.super_StateMachine.state_.index_ == '\x02') {
          std::operator<<((ostream *)&std::cout,'\n');
          state_machine::state_machine::StateMachine<$9a4d5606$>::~StateMachine
                    (&p.super_StateMachine);
          return 0;
        }
        __assert_fail("p.is_state<Stopped>()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                      ,0xae,"int main()");
      }
      __assert_fail("p.is_state<Stopped>()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                    ,0xa7,"int main()");
    }
    __assertion = "p.is_state<Open>()";
    __line = 0x7e;
  }
  else {
    __assertion = "p.is_state<Empty>()";
    __line = 0x79;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                ,__line,"int main()");
}

Assistant:

auto main() -> int {
    // The state machine starts as soon as it is created.
    auto p = Player{};
    assert(p.is_state<Empty>());

    std::cout << '\n';

    p.process_event(open_close());
    assert(p.is_state<Open>());

    std::cout << '\n';

    p.process_event(open_close());
    assert(p.is_state<Empty>());

    std::cout << '\n';

    // will be rejected, wrong disk type
    p.process_event(cd_detected(DiskType::DVD));
    assert(p.is_state<Empty>());

    std::cout << '\n';

    p.process_event(cd_detected(DiskType::CD));
    assert(p.is_state<Stopped>());

    std::cout << '\n';

    p.process_event(play());
    assert(p.is_state<Playing>());

    std::cout << '\n';

    p.process_event(pause());
    assert(p.is_state<Paused>());

    std::cout << '\n';

    p.process_event(end_pause());
    assert(p.is_state<Playing>());

    std::cout << '\n';

    p.process_event(pause());
    assert(p.is_state<Paused>());

    std::cout << '\n';

    p.process_event(stop());
    assert(p.is_state<Stopped>());

    std::cout << '\n';

    // event leading to the same state
    // no action method called as it is not present in the transition table
    p.process_event(stop());
    assert(p.is_state<Stopped>());

    std::cout << '\n';

    return 0;
}